

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nifti1_io.c
# Opt level: O1

znzFile nifti_image_open(char *hname,char *opts,nifti_image **nim)

{
  char *fname;
  int use_compression;
  nifti_image *pnVar1;
  znzFile pzVar2;
  
  pnVar1 = nifti_image_read(hname,0);
  *nim = pnVar1;
  if ((((pnVar1 != (nifti_image *)0x0) && (fname = pnVar1->iname, fname != (char *)0x0)) &&
      (0 < pnVar1->nbyper)) && (pnVar1->nvox != 0)) {
    use_compression = nifti_is_gzfile(fname);
    pzVar2 = znzopen(fname,opts,use_compression);
    if (pzVar2 != (znzFile)0x0) {
      return pzVar2;
    }
  }
  nifti_image_open_cold_1();
  return (znzFile)0x0;
}

Assistant:

znzFile nifti_image_open(const char * hname, char * opts, nifti_image ** nim)
{
  znzFile fptr=NULL;
  /* open the hdr and reading it in, but do not load the data  */
  *nim = nifti_image_read(hname,0);
  /* open the image file, ready for reading (compressed works for all reads) */
  if( ((*nim) == NULL)      || ((*nim)->iname == NULL) ||
      ((*nim)->nbyper <= 0) || ((*nim)->nvox <= 0)       )
     ERREX("bad header info") ;

  /* open image data file */
  fptr = znzopen( (*nim)->iname, opts, nifti_is_gzfile((*nim)->iname) );
  if( znz_isnull(fptr) ) ERREX("Can't open data file") ;

  return fptr;
}